

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O3

wstring * __thiscall
lzstring::LZString::Compress
          (wstring *__return_storage_ptr__,LZString *this,wstring *input,int bitsPerChar,
          GetCharFromIntFunc *func)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  pointer pwVar2;
  int iVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  iterator iVar8;
  uint *puVar9;
  undefined8 uVar10;
  undefined4 in_register_0000000c;
  int iVar11;
  wchar_t wVar12;
  wchar_t wVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  double dVar18;
  wstring contextStr;
  wstring contextW;
  wstring contextWc;
  StringDict contextDict;
  StringFlagDict contextFlagDict;
  int local_14c;
  int local_140;
  int local_13c;
  key_type local_138;
  key_type local_118;
  long *local_f8;
  ulong local_f0;
  long local_e8 [2];
  key_type local_d8;
  undefined8 local_b8;
  wstring *local_b0;
  ulong local_a8;
  _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a0;
  _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_b8 = CONCAT44(in_register_0000000c,bitsPerChar);
  if (input->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  }
  else {
    local_a0._M_buckets = &local_a0._M_single_bucket;
    local_a0._M_bucket_count = 1;
    local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_a0._M_element_count = 0;
    local_a0._M_rehash_policy._M_max_load_factor = 1.0;
    local_a0._M_rehash_policy._M_next_resize = 0;
    local_a0._M_single_bucket = (__node_base_ptr)0x0;
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = L'\0';
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_118._M_string_length = 0;
    local_118.field_2._M_local_buf[0] = L'\0';
    paVar1 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    uVar7 = 0;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
    iVar14 = bitsPerChar + -1;
    local_13c = 3;
    local_14c = 2;
    iVar11 = 0;
    iVar17 = 0;
    local_140 = 2;
    local_b0 = input;
    do {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      local_a8 = uVar7;
      std::__cxx11::wstring::_M_construct((ulong)&local_138,L'\x01');
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_a0,&local_138);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_true>
          ._M_cur == (__node_type *)0x0) {
        pmVar5 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_a0,&local_138);
        *pmVar5 = local_13c;
        pmVar6 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_68,&local_138);
        local_13c = local_13c + 1;
        *pmVar6 = true;
      }
      local_f8 = local_e8;
      std::__cxx11::wstring::_M_construct<wchar_t*>
                ((wstring *)&local_f8,local_118._M_dataplus._M_p,
                 local_118._M_dataplus._M_p + local_118._M_string_length);
      std::__cxx11::wstring::_M_replace_aux((ulong)&local_f8,local_f0,0,L'\x01');
      std::__cxx11::wstring::operator=((wstring *)&local_d8,(wstring *)&local_f8);
      if (local_f8 != local_e8) {
        operator_delete(local_f8,local_e8[0] * 4 + 4);
      }
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_a0,&local_d8);
      wVar13 = (wchar_t)__return_storage_ptr__;
      if (iVar4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_true>
          ._M_cur == (__node_type *)0x0) {
        iVar8 = std::
                _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&local_68,&local_118);
        if (iVar8.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_true>
            ._M_cur == (__node_type *)0x0) {
          puVar9 = (uint *)std::__detail::
                           _Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           ::operator[]((_Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                         *)&local_a0,&local_118);
          if (local_14c == 0) {
            local_14c = 0;
          }
          else {
            lVar16 = (long)local_14c;
            uVar15 = *puVar9;
            do {
              iVar17 = (uVar15 & 1) + iVar17 * 2;
              if (iVar11 == iVar14) {
                local_f8 = (long *)CONCAT44(local_f8._4_4_,iVar17);
                if ((func->super__Function_base)._M_manager == (_Manager_type)0x0)
                goto LAB_00107633;
                (*func->_M_invoker)((_Any_data *)func,(int *)&local_f8);
                iVar17 = 0;
                std::__cxx11::wstring::push_back(wVar13);
                iVar11 = 0;
              }
              else {
                iVar11 = iVar11 + 1;
              }
              uVar15 = (int)uVar15 >> 1;
              lVar16 = lVar16 + -1;
            } while (lVar16 != 0);
          }
        }
        else {
          wVar12 = *local_118._M_dataplus._M_p;
          lVar16 = (long)local_14c;
          if (wVar12 < L'Ā') {
            if (local_14c != 0) {
              do {
                iVar17 = iVar17 * 2;
                if (iVar11 == iVar14) {
                  local_f8 = (long *)CONCAT44(local_f8._4_4_,iVar17);
                  if ((func->super__Function_base)._M_manager == (_Manager_type)0x0)
                  goto LAB_00107638;
                  (*func->_M_invoker)((_Any_data *)func,(int *)&local_f8);
                  iVar17 = 0;
                  std::__cxx11::wstring::push_back(wVar13);
                  iVar11 = 0;
                }
                else {
                  iVar11 = iVar11 + 1;
                }
                lVar16 = lVar16 + -1;
              } while (lVar16 != 0);
              wVar12 = *local_118._M_dataplus._M_p;
            }
            lVar16 = 8;
            do {
              iVar17 = (wVar12 & 1U) + iVar17 * 2;
              if (iVar11 == iVar14) {
                local_f8 = (long *)CONCAT44(local_f8._4_4_,iVar17);
                if ((func->super__Function_base)._M_manager == (_Manager_type)0x0)
                goto LAB_0010762e;
                (*func->_M_invoker)((_Any_data *)func,(int *)&local_f8);
                iVar17 = 0;
                std::__cxx11::wstring::push_back(wVar13);
                iVar11 = 0;
              }
              else {
                iVar11 = iVar11 + 1;
              }
              wVar12 = wVar12 >> 1;
              lVar16 = lVar16 + -1;
            } while (lVar16 != 0);
          }
          else {
            if (local_14c != 0) {
              iVar3 = 1;
              do {
                iVar17 = iVar3 + iVar17 * 2;
                if (iVar11 == iVar14) {
                  local_f8 = (long *)CONCAT44(local_f8._4_4_,iVar17);
                  if ((func->super__Function_base)._M_manager == (_Manager_type)0x0)
                  goto LAB_0010763d;
                  (*func->_M_invoker)((_Any_data *)func,(int *)&local_f8);
                  iVar17 = 0;
                  std::__cxx11::wstring::push_back(wVar13);
                  iVar11 = 0;
                }
                else {
                  iVar11 = iVar11 + 1;
                }
                iVar3 = 0;
                lVar16 = lVar16 + -1;
              } while (lVar16 != 0);
              wVar12 = *local_118._M_dataplus._M_p;
            }
            lVar16 = 0x10;
            do {
              iVar17 = (wVar12 & 1U) + iVar17 * 2;
              if (iVar11 == iVar14) {
                local_f8 = (long *)CONCAT44(local_f8._4_4_,iVar17);
                if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
                  std::__throw_bad_function_call();
                  goto LAB_0010762e;
                }
                (*func->_M_invoker)((_Any_data *)func,(int *)&local_f8);
                iVar17 = 0;
                std::__cxx11::wstring::push_back(wVar13);
                iVar11 = 0;
              }
              else {
                iVar11 = iVar11 + 1;
              }
              wVar12 = wVar12 >> 1;
              lVar16 = lVar16 + -1;
            } while (lVar16 != 0);
          }
          local_140 = local_140 + -1;
          if (local_140 == 0) {
            dVar18 = ldexp(1.0,local_14c);
            local_140 = (int)dVar18;
            local_14c = local_14c + 1;
          }
          std::
          _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_erase(&local_68,&local_118);
        }
        local_140 = local_140 + -1;
        if (local_140 == 0) {
          dVar18 = ldexp(1.0,local_14c);
          local_140 = (int)dVar18;
          local_14c = local_14c + 1;
        }
        pmVar5 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_a0,&local_d8);
        *pmVar5 = local_13c;
        std::__cxx11::wstring::_M_assign((wstring *)&local_118);
        local_13c = local_13c + 1;
      }
      else {
        std::__cxx11::wstring::_M_assign((wstring *)&local_118);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity * 4 + 4);
      }
      uVar7 = local_a8 + 1;
    } while (uVar7 < local_b0->_M_string_length);
    if (local_118._M_string_length != 0) {
      iVar8 = std::
              _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_68,&local_118);
      if (iVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_true>
          ._M_cur == (__node_type *)0x0) {
        puVar9 = (uint *)std::__detail::
                         _Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&local_a0,&local_118);
        if (local_14c == 0) {
          local_14c = 0;
        }
        else {
          lVar16 = (long)local_14c;
          uVar15 = *puVar9;
          do {
            iVar17 = (uVar15 & 1) + iVar17 * 2;
            if (iVar11 == iVar14) {
              local_138._M_dataplus._M_p._0_4_ = iVar17;
              if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00107651;
              (*func->_M_invoker)((_Any_data *)func,(int *)&local_138);
              iVar17 = 0;
              std::__cxx11::wstring::push_back(wVar13);
              iVar11 = 0;
            }
            else {
              iVar11 = iVar11 + 1;
            }
            uVar15 = (int)uVar15 >> 1;
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
        }
      }
      else {
        wVar12 = *local_118._M_dataplus._M_p;
        lVar16 = (long)local_14c;
        if (wVar12 < L'Ā') {
          if (local_14c != 0) {
            do {
              iVar17 = iVar17 * 2;
              if (iVar11 == iVar14) {
                local_138._M_dataplus._M_p._0_4_ = iVar17;
                if ((func->super__Function_base)._M_manager == (_Manager_type)0x0)
                goto LAB_00107656;
                (*func->_M_invoker)((_Any_data *)func,(int *)&local_138);
                iVar17 = 0;
                std::__cxx11::wstring::push_back(wVar13);
                iVar11 = 0;
              }
              else {
                iVar11 = iVar11 + 1;
              }
              lVar16 = lVar16 + -1;
            } while (lVar16 != 0);
            wVar12 = *local_118._M_dataplus._M_p;
          }
          lVar16 = 8;
          do {
            iVar17 = (wVar12 & 1U) + iVar17 * 2;
            if (iVar11 == iVar14) {
              local_138._M_dataplus._M_p._0_4_ = iVar17;
              if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00107647;
              (*func->_M_invoker)((_Any_data *)func,(int *)&local_138);
              iVar17 = 0;
              std::__cxx11::wstring::push_back(wVar13);
              iVar11 = 0;
            }
            else {
              iVar11 = iVar11 + 1;
            }
            wVar12 = wVar12 >> 1;
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
        }
        else {
          if (local_14c != 0) {
            iVar3 = 1;
            do {
              iVar17 = iVar3 + iVar17 * 2;
              if (iVar11 == iVar14) {
                local_138._M_dataplus._M_p._0_4_ = iVar17;
                if ((func->super__Function_base)._M_manager == (_Manager_type)0x0)
                goto LAB_0010765b;
                (*func->_M_invoker)((_Any_data *)func,(int *)&local_138);
                iVar17 = 0;
                std::__cxx11::wstring::push_back(wVar13);
                iVar11 = 0;
              }
              else {
                iVar11 = iVar11 + 1;
              }
              iVar3 = 0;
              lVar16 = lVar16 + -1;
            } while (lVar16 != 0);
            wVar12 = *local_118._M_dataplus._M_p;
          }
          lVar16 = 0x10;
          do {
            iVar17 = (wVar12 & 1U) + iVar17 * 2;
            if (iVar11 == iVar14) {
              local_138._M_dataplus._M_p._0_4_ = iVar17;
              if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0010764c;
              (*func->_M_invoker)((_Any_data *)func,(int *)&local_138);
              iVar17 = 0;
              std::__cxx11::wstring::push_back(wVar13);
              iVar11 = 0;
            }
            else {
              iVar11 = iVar11 + 1;
            }
            wVar12 = wVar12 >> 1;
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
        }
        local_140 = local_140 + -1;
        if (local_140 == 0) {
          dVar18 = ldexp(1.0,local_14c);
          local_140 = (int)dVar18;
          local_14c = local_14c + 1;
        }
        std::
        _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_erase(&local_68,&local_118);
      }
      if (local_140 == 1) {
        ldexp(1.0,local_14c);
        local_14c = local_14c + 1;
      }
    }
    if (local_14c != 0) {
      lVar16 = (long)local_14c;
      uVar15 = 2;
      do {
        iVar17 = (uVar15 & 1) + iVar17 * 2;
        if (iVar11 == iVar14) {
          local_138._M_dataplus._M_p._0_4_ = iVar17;
          if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00107642;
          (*func->_M_invoker)((_Any_data *)func,(int *)&local_138);
          iVar17 = 0;
          std::__cxx11::wstring::push_back(wVar13);
          iVar11 = 0;
        }
        else {
          iVar11 = iVar11 + 1;
        }
        uVar15 = uVar15 >> 1;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
    iVar11 = (int)local_b8 - iVar11;
    do {
      iVar17 = iVar17 * 2;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
    local_138._M_dataplus._M_p._0_4_ = iVar17;
    if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00107660;
    (*func->_M_invoker)((_Any_data *)func,(int *)&local_138);
    std::__cxx11::wstring::push_back(wVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT44(local_118.field_2._M_local_buf[1],local_118.field_2._M_local_buf[0])
                      * 4 + 4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT44(local_d8.field_2._M_local_buf[1],local_d8.field_2._M_local_buf[0]) *
                      4 + 4);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_68);
    std::
    _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_a0);
  }
  return __return_storage_ptr__;
LAB_0010762e:
  std::__throw_bad_function_call();
LAB_00107633:
  std::__throw_bad_function_call();
LAB_00107638:
  std::__throw_bad_function_call();
LAB_0010763d:
  std::__throw_bad_function_call();
LAB_00107642:
  std::__throw_bad_function_call();
LAB_00107647:
  std::__throw_bad_function_call();
LAB_0010764c:
  std::__throw_bad_function_call();
LAB_00107651:
  std::__throw_bad_function_call();
LAB_00107656:
  std::__throw_bad_function_call();
LAB_0010765b:
  std::__throw_bad_function_call();
LAB_00107660:
  uVar10 = std::__throw_bad_function_call();
  pwVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar2 != paVar1) {
    operator_delete(pwVar2,paVar1->_M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT44(local_118.field_2._M_local_buf[1],local_118.field_2._M_local_buf[0]) *
                    4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT44(local_d8.field_2._M_local_buf[1],local_d8.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  std::
  _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_a0);
  _Unwind_Resume(uVar10);
}

Assistant:

std::wstring LZString::Compress(const std::wstring &input, const int bitsPerChar, GetCharFromIntFunc func)
{
	if (input.empty())
		return std::wstring();

	int i = 0, value = 0;
	StringDict contextDict;
	StringFlagDict contextFlagDict;
	std::wstring contextWc;
	std::wstring contextW;
	int contextEnlargeIn = 2; // Compensate for the first entry which should not count
	int contextDictSize = 3;
	int contextNumBits = 2;
	std::wstring contextData;
	int contextDataVal = 0;
	int contextDataPosition = 0;

	for (size_t index = 0; index < input.size(); index++)
	{
		wchar_t contextC = input[index];
		std::wstring contextStr = std::wstring(1, contextC);
		if (contextDict.find(contextStr) == contextDict.end())
		{
			contextDict[contextStr] = contextDictSize++;
			contextFlagDict[contextStr] = true;
		}

		contextWc = contextW + contextC;
		if (contextDict.find(contextWc) != contextDict.end())
		{
			contextW = contextWc;
		}
		else
		{
			if (contextFlagDict.find(contextW) != contextFlagDict.end())
			{
				if ((int)contextW[0] < 256)
				{
					for (size_t i = 0; i < contextNumBits; i++)
					{
						contextDataVal = (contextDataVal << 1);
						if (contextDataPosition == bitsPerChar - 1)
						{
							contextDataPosition = 0;
							contextData.push_back(func(contextDataVal));
							contextDataVal = 0;
						}
						else
						{
							contextDataPosition++;
						}
					}

					value = contextW[0];
					for (size_t i = 0; i < 8; i++)
					{
						contextDataVal = (contextDataVal << 1) | (value & 1);
						if (contextDataPosition == bitsPerChar - 1)
						{
							contextDataPosition = 0;
							contextData.push_back(func(contextDataVal));
							contextDataVal = 0;
						}
						else
						{
							contextDataPosition++;
						}
						value = value >> 1;
					}
				}
				else
				{
					value = 1;
					for (size_t i = 0; i < contextNumBits; i++)
					{
						contextDataVal = (contextDataVal << 1) | value;
						if (contextDataPosition == bitsPerChar - 1)
						{
							contextDataPosition = 0;
							contextData.push_back(func(contextDataVal));
							contextDataVal = 0;
						}
						else
						{
							contextDataPosition++;
						}
						value = 0;
					}

					value = contextW[0];
					for (size_t i = 0; i < 16; i++)
					{
						contextDataVal = (contextDataVal << 1) | (value & 1);
						if (contextDataPosition == bitsPerChar - 1)
						{
							contextDataPosition = 0;
							contextData.push_back(func(contextDataVal));
							contextDataVal = 0;
						}
						else
						{
							contextDataPosition++;
						}
						value = value >> 1;
					}
				}
				contextEnlargeIn--;
				if (contextEnlargeIn == 0)
				{
					contextEnlargeIn = (int)pow(2, contextNumBits);
					contextNumBits++;
				}
				contextFlagDict.erase(contextW);
			}
			else
			{
				value = contextDict[contextW];
				for (size_t i = 0; i < contextNumBits; i++)
				{
					contextDataVal = (contextDataVal << 1) | (value & 1);
					if (contextDataPosition == bitsPerChar - 1)
					{
						contextDataPosition = 0;
						contextData.push_back(func(contextDataVal));
						contextDataVal = 0;
					}
					else
					{
						contextDataPosition++;
					}
					value = value >> 1;
				}
			}
			contextEnlargeIn--;
			if (contextEnlargeIn == 0)
			{
				contextEnlargeIn = (int)pow(2, contextNumBits);
				contextNumBits++;
			}
			// Add wc to the dictionary
			contextDict[contextWc] = contextDictSize++;
			contextW = contextStr;
		}
	}

	// Output the code for w.
	if (!contextW.empty())
	{
		if (contextFlagDict.find(contextW) != contextFlagDict.end())
		{
			if (contextW[0] < 256)
			{
				for (size_t i = 0; i < contextNumBits; i++)
				{
					contextDataVal = (contextDataVal << 1);
					if (contextDataPosition == bitsPerChar - 1)
					{
						contextDataPosition = 0;
						contextData.push_back(func(contextDataVal));
						contextDataVal = 0;
					}
					else
					{
						contextDataPosition++;
					}
				}
				value = contextW[0];
				for (size_t i = 0; i < 8; i++)
				{
					contextDataVal = (contextDataVal << 1) | (value & 1);
					if (contextDataPosition == bitsPerChar - 1)
					{
						contextDataPosition = 0;
						contextData.push_back(func(contextDataVal));
						contextDataVal = 0;
					}
					else
					{
						contextDataPosition++;
					}
					value = value >> 1;
				}
			}
			else
			{
				value = 1;
				for (size_t i = 0; i < contextNumBits; i++)
				{
					contextDataVal = (contextDataVal << 1) | value;
					if (contextDataPosition == bitsPerChar - 1)
					{
						contextDataPosition = 0;
						contextData.push_back(func(contextDataVal));
						contextDataVal = 0;
					}
					else
					{
						contextDataPosition++;
					}
					value = 0;
				}
				value = contextW[0];
				for (size_t i = 0; i < 16; i++)
				{
					contextDataVal = (contextDataVal << 1) | (value & 1);
					if (contextDataPosition == bitsPerChar - 1)
					{
						contextDataPosition = 0;
						contextData.push_back(func(contextDataVal));
						contextDataVal = 0;
					}
					else
					{
						contextDataPosition++;
					}
					value = value >> 1;
				}
			}
			contextEnlargeIn--;
			if (contextEnlargeIn == 0)
			{
				contextEnlargeIn = (int)pow(2, contextNumBits);
				contextNumBits++;
			}
			contextFlagDict.erase(contextW);
		}
		else
		{
			value = contextDict[contextW];
			for (size_t i = 0; i < contextNumBits; i++)
			{
				contextDataVal = (contextDataVal << 1) | (value & 1);
				if (contextDataPosition == bitsPerChar - 1)
				{
					contextDataPosition = 0;
					contextData.push_back(func(contextDataVal));
					contextDataVal = 0;
				}
				else
				{
					contextDataPosition++;
				}
				value = value >> 1;
			}
		}

		contextEnlargeIn--;
		if (contextEnlargeIn == 0)
		{
			contextEnlargeIn = (int)pow(2, contextNumBits);
			contextNumBits++;
		}
	}

	// Mark the end of the stream
	value = 2;
	for (size_t i = 0; i < contextNumBits; i++)
	{
		contextDataVal = (contextDataVal << 1) | (value & 1);
		if (contextDataPosition == bitsPerChar - 1)
		{
			contextDataPosition = 0;
			contextData.push_back(func(contextDataVal));
			contextDataVal = 0;
		}
		else
		{
			contextDataPosition++;
		}
		value = value >> 1;
	}

	// Flush the last char
	while (true)
	{
		contextDataVal = (contextDataVal << 1);
		if (contextDataPosition == bitsPerChar - 1)
		{
			contextData.push_back(func(contextDataVal));
			break;
		}
		else
		{
			contextDataPosition++;
		}
	}

	return contextData;
}